

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception-test.c++
# Opt level: O0

void __thiscall kj::_::anon_unknown_0::TestCase32::run(TestCase32 *this)

{
  bool bVar1;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  StringPtr filename;
  StringPtr filename_00;
  StringPtr local_98;
  ArrayPtr<const_char> local_88;
  bool local_71;
  undefined1 auStack_70 [7];
  bool _kj_shouldLog;
  char *local_68;
  ArrayPtr<const_char> local_60;
  ArrayPtr<const_char> local_50;
  undefined1 local_40 [8];
  DebugComparison<kj::StringPtr,_const_char_(&)[22]> _kjCondition;
  TestCase32 *this_local;
  
  _kjCondition._40_8_ = this;
  StringPtr::StringPtr
            ((StringPtr *)auStack_70,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/exception-test.c++"
            );
  filename.content.size_ = extraout_RDX;
  filename.content.ptr = local_68;
  local_60 = (ArrayPtr<const_char>)trimSourceFilename(_auStack_70,filename);
  local_50 = (ArrayPtr<const_char>)
             DebugExpressionStart::operator<<
                       ((DebugExpressionStart *)&_::MAGIC_ASSERT,(StringPtr *)&local_60);
  DebugExpression<kj::StringPtr>::operator==
            ((DebugComparison<kj::StringPtr,_const_char_(&)[22]> *)local_40,
             (DebugExpression<kj::StringPtr> *)&local_50,(char (*) [22])0x319720);
  bVar1 = DebugComparison::operator_cast_to_bool((DebugComparison *)local_40);
  if (!bVar1) {
    local_71 = Debug::shouldLog(ERROR);
    while (local_71 != false) {
      StringPtr::StringPtr
                (&local_98,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/exception-test.c++"
                );
      filename_00.content.size_ = extraout_RDX_00;
      filename_00.content.ptr = (char *)local_98.content.size_;
      local_88 = (ArrayPtr<const_char>)trimSourceFilename((kj *)local_98.content.ptr,filename_00);
      Debug::
      log<char_const(&)[172],kj::_::DebugComparison<kj::StringPtr,char_const(&)[22]>&,kj::StringPtr,char_const(&)[22]>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/exception-test.c++"
                 ,0x25,ERROR,
                 "\"failed: expected \" \"(trimSourceFilename(\\\"/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/exception-test.c++\\\")) == (\\\"kj/exception-test.c++\\\")\", _kjCondition, trimSourceFilename(\"/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/exception-test.c++\"), \"kj/exception-test.c++\""
                 ,(char (*) [172])
                  "failed: expected (trimSourceFilename(\"/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/exception-test.c++\")) == (\"kj/exception-test.c++\")"
                 ,(DebugComparison<kj::StringPtr,_const_char_(&)[22]> *)local_40,
                 (StringPtr *)&local_88,(char (*) [22])0x319720);
      local_71 = false;
    }
  }
  return;
}

Assistant:

TEST(Exception, TrimSourceFilename) {
#if _WIN32
  EXPECT_TRUE(trimSourceFilename(__FILE__) == "kj/exception-test.c++" ||
              trimSourceFilename(__FILE__) == "kj\\exception-test.c++");
#else
  EXPECT_EQ(trimSourceFilename(__FILE__), "kj/exception-test.c++");
#endif
}